

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_renderhacks.cpp
# Opt level: O0

void __thiscall
FDrawInfo::AddUpperMissingTexture(FDrawInfo *this,side_t *side,subsector_t *sub,float Backheight)

{
  seg_t *psVar1;
  uint uVar2;
  MissingTextureInfo *pMVar3;
  uint local_5c;
  undefined1 auStack_58 [4];
  uint i_1;
  MissingSegInfo msi;
  MissingTextureInfo mti;
  seg_t *seg;
  int i;
  float Backheight_local;
  subsector_t *sub_local;
  side_t *side_local;
  FDrawInfo *this_local;
  
  if ((*side->segs)->backsector != (sector_t *)0x0) {
    glcycle_t::Clock(&totalms);
    for (seg._0_4_ = 0; (int)seg < side->numsegs; seg._0_4_ = (int)seg + 1) {
      psVar1 = side->segs[(int)seg];
      if (psVar1->Subsector == sub) {
        memset(&msi.MTI_Index,0,0x18);
        if ((sub->render_sector != sub->sector) || (psVar1->frontsector != sub->sector)) {
          glcycle_t::Unclock(&totalms);
          return;
        }
        for (local_5c = 0;
            uVar2 = TArray<FDrawInfo::MissingTextureInfo,_FDrawInfo::MissingTextureInfo>::Size
                              (&this->MissingUpperTextures), local_5c < uVar2;
            local_5c = local_5c + 1) {
          pMVar3 = TArray<FDrawInfo::MissingTextureInfo,_FDrawInfo::MissingTextureInfo>::operator[]
                             (&this->MissingUpperTextures,(ulong)local_5c);
          if (pMVar3->sub == sub) {
            pMVar3 = TArray<FDrawInfo::MissingTextureInfo,_FDrawInfo::MissingTextureInfo>::
                     operator[](&this->MissingUpperTextures,(ulong)local_5c);
            if (Backheight < pMVar3->Planez) {
              pMVar3 = TArray<FDrawInfo::MissingTextureInfo,_FDrawInfo::MissingTextureInfo>::
                       operator[](&this->MissingUpperTextures,(ulong)local_5c);
              pMVar3->Planez = Backheight;
              pMVar3 = TArray<FDrawInfo::MissingTextureInfo,_FDrawInfo::MissingTextureInfo>::
                       operator[](&this->MissingUpperTextures,(ulong)local_5c);
              pMVar3->seg = psVar1;
            }
            msi.seg._0_4_ = local_5c;
            _auStack_58 = psVar1;
            TArray<FDrawInfo::MissingSegInfo,_FDrawInfo::MissingSegInfo>::Push
                      (&this->MissingUpperSegs,(MissingSegInfo *)auStack_58);
            glcycle_t::Unclock(&totalms);
            return;
          }
        }
        msi._8_8_ = psVar1;
        msi.seg._0_4_ =
             TArray<FDrawInfo::MissingTextureInfo,_FDrawInfo::MissingTextureInfo>::Push
                       (&this->MissingUpperTextures,(MissingTextureInfo *)&msi.MTI_Index);
        _auStack_58 = psVar1;
        TArray<FDrawInfo::MissingSegInfo,_FDrawInfo::MissingSegInfo>::Push
                  (&this->MissingUpperSegs,(MissingSegInfo *)auStack_58);
      }
    }
    glcycle_t::Unclock(&totalms);
  }
  return;
}

Assistant:

void FDrawInfo::AddUpperMissingTexture(side_t * side, subsector_t *sub, float Backheight)
{
	if (!side->segs[0]->backsector) return;

	totalms.Clock();
	for (int i = 0; i < side->numsegs; i++)
	{
		seg_t *seg = side->segs[i];

		// we need find the seg belonging to the passed subsector
		if (seg->Subsector == sub)
		{
			MissingTextureInfo mti = {};
			MissingSegInfo msi;


			if (sub->render_sector != sub->sector || seg->frontsector != sub->sector)
			{
				totalms.Unclock();
				return;
			}

			for (unsigned int i = 0; i < MissingUpperTextures.Size(); i++)
			{
				if (MissingUpperTextures[i].sub == sub)
				{
					// Use the lowest adjoining height to draw a fake ceiling if necessary
					if (Backheight < MissingUpperTextures[i].Planez)
					{
						MissingUpperTextures[i].Planez = Backheight;
						MissingUpperTextures[i].seg = seg;
					}

					msi.MTI_Index = i;
					msi.seg = seg;
					MissingUpperSegs.Push(msi);
					totalms.Unclock();
					return;
				}
			}
			mti.seg = seg;
			mti.sub = sub;
			mti.Planez = Backheight;
			msi.MTI_Index = MissingUpperTextures.Push(mti);
			msi.seg = seg;
			MissingUpperSegs.Push(msi);
		}
	}
	totalms.Unclock();
}